

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O0

int nn_xpub_add(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist *self_00;
  nn_pipe *in_RSI;
  nn_dist_data *in_RDI;
  nn_xpub_data *data;
  nn_xpub *xpub;
  
  if (in_RDI == (nn_dist_data *)0x0) {
    in_RDI = (nn_dist_data *)0x0;
  }
  self_00 = (nn_dist *)nn_alloc_(0x13da0c);
  if (self_00 != (nn_dist *)0x0) {
    nn_dist_add(self_00,in_RDI,(nn_pipe *)0x13da80);
    nn_pipe_setdata(in_RSI,self_00);
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/pubsub/xpub.c"
          ,0x6e);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xpub_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpub *xpub;
    struct nn_xpub_data *data;

    xpub = nn_cont (self, struct nn_xpub, sockbase);

    data = nn_alloc (sizeof (struct nn_xpub_data), "pipe data (pub)");
    alloc_assert (data);
    nn_dist_add (&xpub->outpipes, &data->item, pipe);
    nn_pipe_setdata (pipe, data);

    return 0;
}